

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O3

void ImportOneRow(uint8_t *r_ptr,uint8_t *g_ptr,uint8_t *b_ptr,int step,int pic_width,fixed_y_t *dst
                 )

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  
  uVar1 = pic_width + 1U & 0xfffffffe;
  if (0 < pic_width) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      dst[uVar2] = (ushort)r_ptr[lVar3] * 4 + 2;
      dst[uVar1 + uVar2] = (ushort)g_ptr[lVar3] * 4 + 2;
      dst[uVar1 * 2 + uVar2] = (ushort)b_ptr[lVar3] * 4 + 2;
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + step;
    } while ((uint)pic_width != uVar2);
  }
  if ((pic_width & 1U) != 0) {
    dst[pic_width] = dst[(long)pic_width + -1];
    dst[(int)(uVar1 + pic_width)] = dst[(long)(int)(uVar1 + pic_width) + -1];
    lVar3 = (long)(int)(pic_width + (pic_width + 1U) * 2);
    dst[lVar3] = dst[lVar3 + -1];
  }
  return;
}

Assistant:

static void ImportOneRow(const uint8_t* const r_ptr,
                         const uint8_t* const g_ptr,
                         const uint8_t* const b_ptr,
                         int step,
                         int pic_width,
                         fixed_y_t* const dst) {
  int i;
  const int w = (pic_width + 1) & ~1;
  for (i = 0; i < pic_width; ++i) {
    const int off = i * step;
    dst[i + 0 * w] = UpLift(r_ptr[off]);
    dst[i + 1 * w] = UpLift(g_ptr[off]);
    dst[i + 2 * w] = UpLift(b_ptr[off]);
  }
  if (pic_width & 1) {  // replicate rightmost pixel
    dst[pic_width + 0 * w] = dst[pic_width + 0 * w - 1];
    dst[pic_width + 1 * w] = dst[pic_width + 1 * w - 1];
    dst[pic_width + 2 * w] = dst[pic_width + 2 * w - 1];
  }
}